

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

bool tinyobj::LoadObjWithCallback
               (istream *inStream,callback_t *callback,void *user_data,MaterialReader *readMatFn,
               string *warn,string *err)

{
  size_t *psVar1;
  byte bVar2;
  byte bVar3;
  pointer pbVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  iterator iVar10;
  reference pvVar11;
  long lVar12;
  code *pcVar13;
  reference pvVar14;
  char **extraout_RDX;
  char **token;
  char **extraout_RDX_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *elems;
  ulong uVar15;
  byte *pbVar16;
  pointer *t;
  byte *pbVar17;
  real_t rVar18;
  real_t rVar19;
  real_t rVar20;
  real_t rVar21;
  stringstream local_4c0 [8];
  stringstream errss;
  undefined1 local_338 [8];
  index_t idx;
  undefined1 local_1b0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  material_map;
  real_t z;
  undefined1 auStack_158 [8];
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  undefined1 auStack_138 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string linebuf;
  undefined1 auStack_f8 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> names_out;
  undefined1 auStack_d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  undefined1 auStack_98 [8];
  vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> indices;
  undefined1 local_78 [8];
  real_t y;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  allocator local_51;
  string *local_50;
  void *local_48;
  callback_t *local_40;
  byte *local_38;
  
  linebuf.field_2._8_8_ = readMatFn;
  local_50 = warn;
  local_48 = user_data;
  local_40 = callback;
  std::__cxx11::stringstream::stringstream(local_4c0);
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&material_map;
  material_map._M_t._M_impl._0_4_ = 0;
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  auStack_98 = (undefined1  [8])0x0;
  indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_158 = (undefined1  [8])0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_138 = (undefined1  [8])0x0;
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_138,2);
  names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&linebuf._M_string_length;
  linebuf._M_dataplus._M_p = (pointer)0x0;
  auStack_f8 = (undefined1  [8])0x0;
  names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  linebuf._M_string_length._0_1_ = 0;
LAB_001142f4:
  while( true ) {
    do {
      do {
        t = &names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        iVar6 = std::istream::peek();
        if (iVar6 == -1) {
          if (err != (string *)0x0) {
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::append((string *)err);
            std::__cxx11::string::~string((string *)local_338);
          }
          std::__cxx11::string::~string
                    ((string *)
                     &names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                    ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)auStack_f8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_138);
          std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector
                    ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                     auStack_158);
          std::_Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::~_Vector_base
                    ((_Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)auStack_98
                    );
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       *)local_1b0);
          std::__cxx11::stringstream::~stringstream(local_4c0);
          return true;
        }
        safeGetline(inStream,(string *)t);
      } while (((linebuf._M_dataplus._M_p == (pointer)0x0) ||
               (((names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].field_2._M_local_buf + 0xf)
                 [(long)linebuf._M_dataplus._M_p] == '\n' &&
                (std::__cxx11::string::erase((ulong)t,(ulong)(linebuf._M_dataplus._M_p + -1)),
                linebuf._M_dataplus._M_p == (pointer)0x0)))) ||
              (((names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].field_2._M_local_buf + 0xf)
                [(long)linebuf._M_dataplus._M_p] == '\r' &&
               (std::__cxx11::string::erase((ulong)t,(ulong)(linebuf._M_dataplus._M_p + -1)),
               linebuf._M_dataplus._M_p == (pointer)0x0))));
      pbVar4 = names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      sVar9 = strspn((char *)names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage," \t");
      pbVar17 = (byte *)((long)&(pbVar4->_M_dataplus)._M_p + sVar9);
      local_38 = pbVar17;
      if (pbVar4 == (pointer)0x0) {
        __assert_fail("token",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/objl/tiny_obj_loader.h"
                      ,0xaa3,
                      "bool tinyobj::LoadObjWithCallback(std::istream &, const callback_t &, void *, MaterialReader *, std::string *, std::string *)"
                     );
      }
      bVar2 = *pbVar17;
    } while ((bVar2 == 0) || (bVar2 == 0x23));
    if (bVar2 != 0x66) break;
    if ((pbVar17[1] != 0x20) && (pbVar17[1] != 9)) goto LAB_001146e7;
    local_38 = pbVar17 + 2;
    sVar9 = strspn((char *)local_38," \t");
    pbVar17 = pbVar17 + sVar9 + 2;
    local_38 = pbVar17;
    if ((undefined1  [8])
        indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
        super__Vector_impl_data._M_start != auStack_98) {
      indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)auStack_98;
    }
    while ((0xd < *pbVar17 || ((0x2401U >> (*pbVar17 & 0x1f) & 1) == 0))) {
      iVar6 = atoi((char *)pbVar17);
      sVar9 = strcspn((char *)pbVar17,"/ \t\r");
      pbVar16 = pbVar17 + sVar9;
      iVar8 = 0;
      if (pbVar17[sVar9] == 0x2f) {
        if (pbVar16[1] == 0x2f) {
          pbVar16 = pbVar16 + 2;
          iVar7 = 0;
        }
        else {
          pbVar17 = pbVar16 + 1;
          iVar7 = atoi((char *)pbVar17);
          sVar9 = strcspn((char *)pbVar17,"/ \t\r");
          pbVar16 = pbVar17 + sVar9;
          if (pbVar17[sVar9] != 0x2f) goto LAB_00114562;
          pbVar16 = pbVar16 + 1;
        }
        iVar8 = atoi((char *)pbVar16);
        sVar9 = strcspn((char *)pbVar16,"/ \t\r");
        pbVar16 = pbVar16 + sVar9;
      }
      else {
        iVar7 = 0;
      }
LAB_00114562:
      local_338._4_4_ = iVar8;
      local_338._0_4_ = iVar6;
      idx.vertex_index = iVar7;
      std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)auStack_98,
                 (value_type *)local_338);
      sVar9 = strspn((char *)pbVar16," \t\r");
      pbVar17 = pbVar16 + sVar9;
    }
    pcVar13 = *(code **)(local_40 + 0x18);
    local_38 = pbVar17;
    if ((pcVar13 != (code *)0x0) &&
       ((undefined1  [8])
        indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
        super__Vector_impl_data._M_start != auStack_98)) {
      pvVar14 = std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::at
                          ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)auStack_98
                           ,0);
      uVar15 = ((long)indices.
                      super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                      _M_impl.super__Vector_impl_data._M_start - (long)auStack_98) / 0xc;
LAB_00114600:
      (*pcVar13)(local_48,pvVar14,uVar15);
    }
  }
  if (bVar2 == 0x76) {
    bVar3 = pbVar17[1];
    if (bVar3 == 9) {
LAB_001143df:
      local_38 = pbVar17 + 2;
      rVar18 = parseReal((char **)&local_38,0.0);
      rVar19 = parseReal((char **)&local_38,0.0);
      rVar20 = parseReal((char **)&local_38,0.0);
      rVar21 = parseReal((char **)&local_38,1.0);
      if (*(code **)local_40 != (code *)0x0) {
        (**(code **)local_40)(rVar18,rVar19,rVar20,rVar21,local_48);
      }
      goto LAB_001142f4;
    }
    if (bVar3 == 0x74) {
      if ((pbVar17[2] == 0x20) || (pbVar17[2] == 9)) {
        local_38 = pbVar17 + 3;
        parseReal3((real_t *)local_338,(real_t *)local_78,
                   (real_t *)&material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (char **)&local_38,0.0,0.0,0.0);
        if (*(code **)(local_40 + 0x10) != (code *)0x0) {
          (**(code **)(local_40 + 0x10))(local_338._0_4_,local_48);
        }
        goto LAB_001142f4;
      }
    }
    else if (bVar3 == 0x6e) {
      if ((pbVar17[2] == 0x20) || (pbVar17[2] == 9)) {
        local_38 = pbVar17 + 3;
        parseReal3((real_t *)local_338,(real_t *)local_78,
                   (real_t *)&material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (char **)&local_38,0.0,0.0,0.0);
        if (*(code **)(local_40 + 8) != (code *)0x0) {
          (**(code **)(local_40 + 8))(local_338._0_4_,local_48);
        }
        goto LAB_001142f4;
      }
    }
    else if (bVar3 == 0x20) goto LAB_001143df;
  }
LAB_001146e7:
  iVar6 = strncmp((char *)pbVar17,"usemtl",6);
  if ((iVar6 == 0) && ((pbVar17[6] == 0x20 || (pbVar17[6] == 9)))) {
    local_38 = pbVar17 + 7;
    std::__cxx11::stringstream::stringstream((stringstream *)local_338);
    std::operator<<((ostream *)&idx.texcoord_index,(char *)(pbVar17 + 7));
    std::__cxx11::stringbuf::str();
    iVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)local_1b0,(key_type *)local_78);
    if (iVar10._M_node == (_Base_ptr)&material_map) {
      pcVar13 = *(code **)(local_40 + 0x20);
      uVar15 = 0xffffffffffffffff;
      if (pcVar13 == (code *)0x0 && local_50 != (string *)0x0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_d8,"material [ ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                      );
        psVar1 = &material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_d8," ] not found in .mtl\n");
        std::__cxx11::string::append((string *)local_50);
        std::__cxx11::string::~string((string *)psVar1);
        std::__cxx11::string::~string((string *)auStack_d8);
        uVar15 = 0xffffffffffffffff;
        goto LAB_00114b45;
      }
    }
    else {
      uVar15 = (ulong)iVar10._M_node[2]._M_color;
LAB_00114b45:
      pcVar13 = *(code **)(local_40 + 0x20);
    }
    if (pcVar13 != (code *)0x0) {
      (*pcVar13)(local_48,local_78,uVar15);
    }
LAB_00114b5c:
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
  }
  else {
    iVar6 = strncmp((char *)pbVar17,"mtllib",6);
    if ((iVar6 == 0) && ((pbVar17[6] == 0x20 || (pbVar17[6] == 9)))) {
      if (linebuf.field_2._8_8_ != 0) {
        local_38 = pbVar17 + 7;
        auStack_d8 = (undefined1  [8])0x0;
        filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::__cxx11::string::string((string *)local_338,(char *)local_38,(allocator *)local_78);
        SplitString((string *)local_338,(char)auStack_d8,elems);
        std::__cxx11::string::~string((string *)local_338);
        if (auStack_d8 ==
            (undefined1  [8])
            filenames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          if (local_50 != (string *)0x0) {
            std::__cxx11::string::append((char *)local_50);
          }
        }
        else {
          uVar15 = 0xffffffffffffffff;
          lVar12 = 0;
          do {
            uVar15 = uVar15 + 1;
            if ((ulong)((long)filenames.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_d8 >> 5) <=
                uVar15) {
              if (local_50 != (string *)0x0) {
                std::__cxx11::string::append((char *)local_50);
              }
              goto LAB_00114be6;
            }
            local_338 = (undefined1  [8])&idx.texcoord_index;
            idx.vertex_index = 0;
            idx.normal_index = 0;
            local_78 = (undefined1  [8])&local_68;
            _y = 0;
            idx.texcoord_index._0_1_ = 0;
            local_68._M_local_buf[0] = '\0';
            psVar1 = &material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
            std::__cxx11::string::string
                      ((string *)psVar1,*(char **)((long)auStack_d8 + lVar12),&local_51);
            cVar5 = (**(code **)(*(long *)linebuf.field_2._8_8_ + 0x10))
                              (linebuf.field_2._8_8_,psVar1,auStack_158,local_1b0,local_338,local_78
                              );
            std::__cxx11::string::~string((string *)psVar1);
            if ((local_50 != (string *)0x0) && (idx._0_8_ != 0)) {
              std::__cxx11::string::append((string *)local_50);
            }
            if ((err != (string *)0x0) && (_y != 0)) {
              std::__cxx11::string::append((string *)err);
            }
            lVar12 = lVar12 + 0x20;
            std::__cxx11::string::~string((string *)local_78);
            std::__cxx11::string::~string((string *)local_338);
          } while (cVar5 == '\0');
          pcVar13 = *(code **)(local_40 + 0x28);
          if (pcVar13 != (code *)0x0) {
            pvVar11 = std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::at
                                ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                  *)auStack_158,0);
            (*pcVar13)(local_48,pvVar11,
                       ((long)materials.
                              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_158) / 0x748
                       & 0xffffffff);
          }
        }
LAB_00114be6:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_d8);
      }
    }
    else if (bVar2 == 0x6f) {
      if ((pbVar17[1] == 0x20) || (pbVar17[1] == 9)) {
        local_38 = pbVar17 + 2;
        std::__cxx11::stringstream::stringstream((stringstream *)local_338);
        std::operator<<((ostream *)&idx.texcoord_index,(char *)(pbVar17 + 2));
        std::__cxx11::stringbuf::str();
        if (*(code **)(local_40 + 0x38) != (code *)0x0) {
          (**(code **)(local_40 + 0x38))(local_48,local_78);
        }
        goto LAB_00114b5c;
      }
    }
    else if ((bVar2 == 0x67) && ((pbVar17[1] == 0x20 || (pbVar17[1] == 9)))) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_138);
      token = extraout_RDX;
      while ((0xd < *pbVar17 || ((0x2401U >> (*pbVar17 & 0x1f) & 1) == 0))) {
        parseString_abi_cxx11_((string *)local_338,(tinyobj *)&local_38,token);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_138,(string *)local_338);
        pbVar17 = local_38;
        sVar9 = strspn((char *)local_38," \t\r");
        pbVar17 = pbVar17 + sVar9;
        local_38 = pbVar17;
        std::__cxx11::string::~string((string *)local_338);
        token = extraout_RDX_00;
      }
      if ((long)names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start - (long)auStack_138 == 0) {
        __assert_fail("names.size() > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/objl/tiny_obj_loader.h"
                      ,0xb42,
                      "bool tinyobj::LoadObjWithCallback(std::istream &, const callback_t &, void *, MaterialReader *, std::string *, std::string *)"
                     );
      }
      if (*(code **)(local_40 + 0x30) != (code *)0x0) {
        uVar15 = (long)names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_138 >> 5;
        if (1 < uVar15) {
          std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)auStack_f8,uVar15 - 1);
          lVar12 = 0x20;
          for (uVar15 = 0;
              uVar15 < (ulong)((long)names_out.
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_f8 >>
                              3); uVar15 = uVar15 + 1) {
            *(char **)((long)auStack_f8 + uVar15 * 8) =
                 *(char **)((long)&((_Alloc_hider *)auStack_138)->_M_p + lVar12);
            lVar12 = lVar12 + 0x20;
          }
          pcVar13 = *(code **)(local_40 + 0x30);
          pvVar14 = (reference)
                    std::vector<const_char_*,_std::allocator<const_char_*>_>::at
                              ((vector<const_char_*,_std::allocator<const_char_*>_> *)auStack_f8,0);
          uVar15 = (ulong)((long)names_out.
                                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start - (long)auStack_f8) >> 3;
          goto LAB_00114600;
        }
        (**(code **)(local_40 + 0x30))(local_48,0,0);
      }
    }
  }
  goto LAB_001142f4;
}

Assistant:

bool LoadObjWithCallback(std::istream &inStream, const callback_t &callback,
                         void *user_data /*= NULL*/,
                         MaterialReader *readMatFn /*= NULL*/,
                         std::string *warn, /* = NULL*/
                         std::string *err /*= NULL*/) {
  std::stringstream errss;

  // material
  std::map<std::string, int> material_map;
  int material_id = -1;  // -1 = invalid

  std::vector<index_t> indices;
  std::vector<material_t> materials;
  std::vector<std::string> names;
  names.reserve(2);
  std::vector<const char *> names_out;

  std::string linebuf;
  while (inStream.peek() != -1) {
    safeGetline(inStream, linebuf);

    // Trim newline '\r\n' or '\n'
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\n')
        linebuf.erase(linebuf.size() - 1);
    }
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\r')
        linebuf.erase(linebuf.size() - 1);
    }

    // Skip if empty line.
    if (linebuf.empty()) {
      continue;
    }

    // Skip leading space.
    const char *token = linebuf.c_str();
    token += strspn(token, " \t");

    assert(token);
    if (token[0] == '\0') continue;  // empty line

    if (token[0] == '#') continue;  // comment line

    // vertex
    if (token[0] == 'v' && IS_SPACE((token[1]))) {
      token += 2;
      // TODO(syoyo): Support parsing vertex color extension.
      real_t x, y, z, w;  // w is optional. default = 1.0
      parseV(&x, &y, &z, &w, &token);
      if (callback.vertex_cb) {
        callback.vertex_cb(user_data, x, y, z, w);
      }
      continue;
    }

    // normal
    if (token[0] == 'v' && token[1] == 'n' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;
      parseReal3(&x, &y, &z, &token);
      if (callback.normal_cb) {
        callback.normal_cb(user_data, x, y, z);
      }
      continue;
    }

    // texcoord
    if (token[0] == 'v' && token[1] == 't' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;  // y and z are optional. default = 0.0
      parseReal3(&x, &y, &z, &token);
      if (callback.texcoord_cb) {
        callback.texcoord_cb(user_data, x, y, z);
      }
      continue;
    }

    // face
    if (token[0] == 'f' && IS_SPACE((token[1]))) {
      token += 2;
      token += strspn(token, " \t");

      indices.clear();
      while (!IS_NEW_LINE(token[0])) {
        vertex_index_t vi = parseRawTriple(&token);

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        indices.push_back(idx);
        size_t n = strspn(token, " \t\r");
        token += n;
      }

      if (callback.index_cb && indices.size() > 0) {
        callback.index_cb(user_data, &indices.at(0),
                          static_cast<int>(indices.size()));
      }

      continue;
    }

    // use mtl
    if ((0 == strncmp(token, "usemtl", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      std::stringstream ss;
      ss << token;
      std::string namebuf = ss.str();

      int newMaterialId = -1;
      std::map<std::string, int>::const_iterator it = material_map.find(namebuf);
      if (it != material_map.end()) {
        newMaterialId = it->second;
      } else {
        // { warn!! material not found }
        if (warn && (!callback.usemtl_cb)) {
          (*warn) += "material [ " + namebuf + " ] not found in .mtl\n";
        }
      }

      if (newMaterialId != material_id) {
        material_id = newMaterialId;
      }

      if (callback.usemtl_cb) {
        callback.usemtl_cb(user_data, namebuf.c_str(), material_id);
      }

      continue;
    }

    // load mtl
    if ((0 == strncmp(token, "mtllib", 6)) && IS_SPACE((token[6]))) {
      if (readMatFn) {
        token += 7;

        std::vector<std::string> filenames;
        SplitString(std::string(token), ' ', filenames);

        if (filenames.empty()) {
          if (warn) {
            (*warn) +=
                "Looks like empty filename for mtllib. Use default "
                "material. \n";
          }
        } else {
          bool found = false;
          for (size_t s = 0; s < filenames.size(); s++) {
            std::string warn_mtl;
            std::string err_mtl;
            bool ok = (*readMatFn)(filenames[s].c_str(), &materials,
                                   &material_map, &warn_mtl, &err_mtl);

            if (warn && (!warn_mtl.empty())) {
              (*warn) += warn_mtl;  // This should be warn message.
            }

            if (err && (!err_mtl.empty())) {
              (*err) += err_mtl;
            }

            if (ok) {
              found = true;
              break;
            }
          }

          if (!found) {
            if (warn) {
              (*warn) +=
                  "Failed to load material file(s). Use default "
                  "material.\n";
            }
          } else {
            if (callback.mtllib_cb) {
              callback.mtllib_cb(user_data, &materials.at(0),
                                 static_cast<int>(materials.size()));
            }
          }
        }
      }

      continue;
    }

    // group name
    if (token[0] == 'g' && IS_SPACE((token[1]))) {
      names.clear();

      while (!IS_NEW_LINE(token[0])) {
        std::string str = parseString(&token);
        names.push_back(str);
        token += strspn(token, " \t\r");  // skip tag
      }

      assert(names.size() > 0);

      if (callback.group_cb) {
        if (names.size() > 1) {
          // create const char* array.
          names_out.resize(names.size() - 1);
          for (size_t j = 0; j < names_out.size(); j++) {
            names_out[j] = names[j + 1].c_str();
          }
          callback.group_cb(user_data, &names_out.at(0),
                            static_cast<int>(names_out.size()));

        } else {
          callback.group_cb(user_data, NULL, 0);
        }
      }

      continue;
    }

    // object name
    if (token[0] == 'o' && IS_SPACE((token[1]))) {
      // @todo { multiple object name? }
      token += 2;

      std::stringstream ss;
      ss << token;
      std::string object_name = ss.str();

      if (callback.object_cb) {
        callback.object_cb(user_data, object_name.c_str());
      }

      continue;
    }

#if 0  // @todo
    if (token[0] == 't' && IS_SPACE(token[1])) {
      tag_t tag;

      token += 2;
      std::stringstream ss;
      ss << token;
      tag.name = ss.str();

      token += tag.name.size() + 1;

      tag_sizes ts = parseTagTriple(&token);

      tag.intValues.resize(static_cast<size_t>(ts.num_ints));

      for (size_t i = 0; i < static_cast<size_t>(ts.num_ints); ++i) {
        tag.intValues[i] = atoi(token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.floatValues.resize(static_cast<size_t>(ts.num_reals));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_reals); ++i) {
        tag.floatValues[i] = parseReal(&token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.stringValues.resize(static_cast<size_t>(ts.num_strings));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_strings); ++i) {
        std::stringstream ss;
        ss << token;
        tag.stringValues[i] = ss.str();
        token += tag.stringValues[i].size() + 1;
      }

      tags.push_back(tag);
    }
#endif

    // Ignore unknown command.
  }

  if (err) {
    (*err) += errss.str();
  }

  return true;
}